

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O1

void xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt)

{
  long lVar1;
  
  if (ctxt == (xmlXIncludeCtxtPtr)0x0) {
    return;
  }
  while (0 < ctxt->urlNr) {
    xmlXIncludeURLPop(ctxt);
  }
  if (ctxt->urlTab != (xmlChar **)0x0) {
    (*xmlFree)(ctxt->urlTab);
  }
  if (0 < ctxt->incNr) {
    lVar1 = 0;
    do {
      if (ctxt->incTab[lVar1] != (xmlXIncludeRefPtr)0x0) {
        xmlXIncludeFreeRef(ctxt->incTab[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < ctxt->incNr);
  }
  if (ctxt->incTab != (xmlXIncludeRefPtr *)0x0) {
    (*xmlFree)(ctxt->incTab);
  }
  if (ctxt->txtTab != (xmlChar **)0x0) {
    if (0 < ctxt->txtNr) {
      lVar1 = 0;
      do {
        if (ctxt->txtTab[lVar1] != (xmlChar *)0x0) {
          (*xmlFree)(ctxt->txtTab[lVar1]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < ctxt->txtNr);
    }
    (*xmlFree)(ctxt->txtTab);
  }
  if (ctxt->txturlTab != (xmlURL *)0x0) {
    if (0 < ctxt->txtNr) {
      lVar1 = 0;
      do {
        if (ctxt->txturlTab[lVar1] != (xmlURL)0x0) {
          (*xmlFree)(ctxt->txturlTab[lVar1]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < ctxt->txtNr);
    }
    (*xmlFree)(ctxt->txturlTab);
  }
  if (ctxt->base != (xmlChar *)0x0) {
    (*xmlFree)(ctxt->base);
  }
  (*xmlFree)(ctxt);
  return;
}

Assistant:

void
xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt) {
    int i;

#ifdef DEBUG_XINCLUDE
    xmlGenericError(xmlGenericErrorContext, "Freeing context\n");
#endif
    if (ctxt == NULL)
	return;
    while (ctxt->urlNr > 0)
	xmlXIncludeURLPop(ctxt);
    if (ctxt->urlTab != NULL)
	xmlFree(ctxt->urlTab);
    for (i = 0;i < ctxt->incNr;i++) {
	if (ctxt->incTab[i] != NULL)
	    xmlXIncludeFreeRef(ctxt->incTab[i]);
    }
    if (ctxt->incTab != NULL)
	xmlFree(ctxt->incTab);
    if (ctxt->txtTab != NULL) {
	for (i = 0;i < ctxt->txtNr;i++) {
	    if (ctxt->txtTab[i] != NULL)
		xmlFree(ctxt->txtTab[i]);
	}
	xmlFree(ctxt->txtTab);
    }
    if (ctxt->txturlTab != NULL) {
	for (i = 0;i < ctxt->txtNr;i++) {
	    if (ctxt->txturlTab[i] != NULL)
		xmlFree(ctxt->txturlTab[i]);
	}
	xmlFree(ctxt->txturlTab);
    }
    if (ctxt->base != NULL) {
        xmlFree(ctxt->base);
    }
    xmlFree(ctxt);
}